

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O1

WifiDebugOstream * operator<<(WifiDebugOstream *sink,int i)

{
  if (i < 0) {
    operator<<(sink,"-");
    i = -i;
  }
  operator<<(sink,i);
  return sink;
}

Assistant:

T& operator<<( T& sink, int i )
{
  // Handle -
  if ( i < 0 )
  {
    sink << "-";   
    i = -i;
  }

  sink << (unsigned int) i;
  return sink;
}